

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyZipExtractFromBuf(SyArchive *pArch,char *zBuf,sxu32 nLen)

{
  sxi32 sVar1;
  bool bVar2;
  uchar *puStack_38;
  sxi32 rc;
  uchar *zEnd;
  uchar *zCentral;
  sxu32 nLen_local;
  char *zBuf_local;
  SyArchive *pArch_local;
  
  if (nLen < 0x62) {
    pArch_local._4_4_ = -0x18;
  }
  else {
    puStack_38 = (uchar *)(zBuf + (nLen - 0x16));
    while( true ) {
      bVar2 = false;
      if ((((int)zBuf + nLen) - (int)puStack_38 < 0x8015) && (bVar2 = false, zBuf < puStack_38)) {
        sVar1 = SyMemcmp(puStack_38,"PK\x05\x06",4);
        bVar2 = sVar1 != 0;
      }
      if (!bVar2) break;
      puStack_38 = puStack_38 + -1;
    }
    pArch_local._4_4_ = ParseEndOfCentralDirectory(pArch,puStack_38);
    if (pArch_local._4_4_ == 0) {
      zEnd = puStack_38 + (int)-pArch->nCentralSize;
      if ((zEnd <= zBuf) || (sVar1 = SyMemcmp(zEnd,"PK\x01\x02",4), sVar1 != 0)) {
        if (nLen <= pArch->nCentralOfft) {
          return -0x18;
        }
        zEnd = (uchar *)(zBuf + pArch->nCentralOfft);
        sVar1 = SyMemcmp(zEnd,"PK\x01\x02",4);
        if (sVar1 != 0) {
          return -0x18;
        }
      }
      pArch_local._4_4_ = ZipExtract(pArch,zEnd,(int)puStack_38 - (int)zEnd,zBuf);
    }
  }
  return pArch_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyZipExtractFromBuf(SyArchive *pArch, const char *zBuf, sxu32 nLen)
 {
 	const unsigned char *zCentral, *zEnd;
 	sxi32 rc;
#if defined(UNTRUST)
 	if( SXARCH_INVALID(pArch) || zBuf == 0 ){
 		return SXERR_INVALID;
 	}
#endif 	
 	/* The miminal size of a zip archive:
 	 * LOCAL_HDR_SZ + CENTRAL_HDR_SZ + END_OF_CENTRAL_HDR_SZ
 	 * 		30				46				22
 	 */
 	 if( nLen < SXZIP_LOCAL_HDRSZ + SXZIP_CENTRAL_HDRSZ + SXZIP_END_CENTRAL_HDRSZ ){
 	 	return SXERR_CORRUPT; /* Don't bother processing return immediately */
 	 }
 	  		
 	zEnd = (unsigned char *)&zBuf[nLen - SXZIP_END_CENTRAL_HDRSZ];
 	/* Find the end of central directory */
 	while( ((sxu32)((unsigned char *)&zBuf[nLen] - zEnd) < (SXZIP_END_CENTRAL_HDRSZ + SXI16_HIGH)) &&
		zEnd > (unsigned char *)zBuf && SyMemcmp(zEnd, "PK\005\006", sizeof(sxu32)) != 0 ){
 		zEnd--;
 	} 	
 	/* Parse the end of central directory */
 	rc = ParseEndOfCentralDirectory(&(*pArch), zEnd);
 	if( rc != SXRET_OK ){
 		return rc;
 	} 	
 	
 	/* Find the starting offset of the central directory */
 	zCentral = &zEnd[-(sxi32)pArch->nCentralSize];
 	if( zCentral <= (unsigned char *)zBuf || SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 		if( pArch->nCentralOfft >= nLen ){
			/* Corrupted central directory offset */
 			return SXERR_CORRUPT;
 		}
 		zCentral = (unsigned char *)&zBuf[pArch->nCentralOfft];
 		if( SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 			/* Corrupted zip archive */
 			return SXERR_CORRUPT;
 		}
 		/* Fall thru and extract all valid entries from the central directory */
 	}
 	rc = ZipExtract(&(*pArch), zCentral, (sxu32)(zEnd - zCentral), (void *)zBuf);
 	return rc;
 }